

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  WalkerManager *this;
  vector<rect,_std::allocator<rect>_> rs;
  Mat image;
  _InputArray local_220;
  vector<rect,_std::allocator<rect>_> local_208;
  Mat local_1f0 [96];
  Mat *local_190 [2];
  Mat local_180 [96];
  Mat local_120 [96];
  Mat local_c0 [144];
  
  this = (WalkerManager *)operator_new(0x20);
  WalkerManager::WalkerManager(this,3);
  do {
    cv::Mat::zeros((int)(string *)local_190,600,600);
    cv::Mat::Mat(local_1f0);
    (**(code **)(*(long *)local_190[0] + 0x18))
              (local_190[0],(string *)local_190,local_1f0,0xffffffff);
    cv::Mat::~Mat(local_c0);
    cv::Mat::~Mat(local_120);
    cv::Mat::~Mat(local_180);
    WalkerManager::UpdateAllWalkers(this);
    WalkerManager::ShowAllWalkers(this,local_1f0);
    WalkerManager::GetRectFromManager(&local_208,this);
    tracker_function(&local_208,local_1f0);
    local_190[0] = local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"image ","");
    local_220.sz.width = 0;
    local_220.sz.height = 0;
    local_220.flags = 0x1010000;
    local_220.obj = local_1f0;
    cv::imshow((string *)local_190,&local_220);
    if (local_190[0] != local_180) {
      operator_delete(local_190[0]);
    }
    cv::waitKey(0x32);
    if (local_208.super__Vector_base<rect,_std::allocator<rect>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_208.super__Vector_base<rect,_std::allocator<rect>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    cv::Mat::~Mat(local_1f0);
  } while( true );
}

Assistant:

int main()
{
    WalkerManager* manager = new WalkerManager(3);

    for(int i=0; i=100; ++i)
    {
        cv::Mat image = cv::Mat::zeros(600, 600, CV_8UC3);
        manager->UpdateAllWalkers();
        manager->ShowAllWalkers(image);

        std::vector<rect> rs = manager->GetRectFromManager();
        tracker_function(rs, image);

        cv::imshow("image ", image);
        cv::waitKey(50);
    }

    delete manager;
}